

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O2

size_t input_to_detect_buf(AvxInputContext *input_ctx,size_t n)

{
  size_t *psVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  
  sVar2 = (input_ctx->detect).position;
  if (sVar2 + n < 0x23) {
    sVar3 = (input_ctx->detect).buf_read;
    uVar5 = sVar3 - sVar2;
    if (uVar5 == 0) {
      n = fread((input_ctx->detect).buf + sVar2,1,n,(FILE *)input_ctx->file);
      psVar1 = &(input_ctx->detect).buf_read;
      *psVar1 = *psVar1 + n;
    }
    else if (uVar5 <= n && n - uVar5 != 0) {
      sVar4 = fread((input_ctx->detect).buf + sVar3,1,n - uVar5,(FILE *)input_ctx->file);
      psVar1 = &(input_ctx->detect).buf_read;
      *psVar1 = *psVar1 + sVar4;
      n = uVar5 + sVar4;
    }
    return n;
  }
  die("Failed to store in the detect buffer, maximum size exceeded.");
}

Assistant:

size_t input_to_detect_buf(struct AvxInputContext *input_ctx, size_t n) {
  if (n + input_ctx->detect.position > DETECT_BUF_SZ) {
    die("Failed to store in the detect buffer, maximum size exceeded.");
  }
  const size_t buffered_bytes =
      input_ctx->detect.buf_read - input_ctx->detect.position;
  size_t read_n;
  if (buffered_bytes == 0) {
    read_n = fread(input_ctx->detect.buf + input_ctx->detect.buf_read, 1, n,
                   input_ctx->file);
    input_ctx->detect.buf_read += read_n;
  } else if (n <= buffered_bytes) {
    // In this case, don't need to do anything as the data is already in
    // the detect buffer
    read_n = n;
  } else {
    read_n = fread(input_ctx->detect.buf + input_ctx->detect.buf_read, 1,
                   n - buffered_bytes, input_ctx->file);
    input_ctx->detect.buf_read += read_n;
    read_n += buffered_bytes;
  }
  return read_n;
}